

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Decode
          (Underwater_Acoustic_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 *V;
  KUINT8 *V_00;
  KUINT8 *V_01;
  pointer pSVar1;
  pointer pSVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer pUVar5;
  pointer pUVar6;
  KUINT16 KVar7;
  KException *this_00;
  int iVar8;
  undefined7 in_register_00000011;
  byte bVar9;
  pointer pSVar10;
  pointer pAVar11;
  pointer pUVar12;
  Shaft sft;
  UnderwaterAcousticEmitterSystem local_80;
  
  KVar7 = KDataStream::GetBufferSize(stream);
  iVar8 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar8 = 0;
  }
  if (iVar8 + (uint)KVar7 < 0x20) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_80.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_80.m_AES;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Decode","");
    KException::KException(this_00,(KString *)&local_80,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EmittingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EventID,stream);
  KDataStream::Read(stream,&this->m_ui8StateUpdateIndicator);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16PassiveParamIndex);
  KDataStream::Read(stream,&this->m_ui8PropPlantConfig);
  V = &this->m_ui8NumShafts;
  KDataStream::Read(stream,V);
  V_00 = &this->m_ui8NumAPA;
  KDataStream::Read(stream,V_00);
  V_01 = &this->m_ui8NumEmitterSys;
  KDataStream::Read(stream,V_01);
  pSVar1 = (this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar10 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      (**(pSVar10->super_DataTypeBase)._vptr_DataTypeBase)(pSVar10);
      pSVar10 = pSVar10 + 1;
    } while (pSVar10 != pSVar2);
    (this->m_vShafts).
    super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  pAVar3 = (this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar4 = (this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar11 = pAVar3;
  if (pAVar4 != pAVar3) {
    do {
      (**(pAVar11->super_DataTypeBase)._vptr_DataTypeBase)(pAVar11);
      pAVar11 = pAVar11 + 1;
    } while (pAVar11 != pAVar4);
    (this->m_vAPA).super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar3;
  }
  pUVar5 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar6 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pUVar12 = pUVar5;
  if (pUVar6 != pUVar5) {
    do {
      (**(pUVar12->super_DataTypeBase)._vptr_DataTypeBase)(pUVar12);
      pUVar12 = pUVar12 + 1;
    } while (pUVar12 != pUVar6);
    (this->m_vUAES).
    super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar5;
  }
  if (*V != '\0') {
    bVar9 = 0;
    do {
      DATA_TYPE::Shaft::Shaft((Shaft *)&local_80);
      (*local_80.super_DataTypeBase._vptr_DataTypeBase[3])(&local_80,stream);
      std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::push_back
                (&this->m_vShafts,(value_type *)&local_80);
      DATA_TYPE::Shaft::~Shaft((Shaft *)&local_80);
      bVar9 = bVar9 + 1;
    } while (bVar9 < *V);
  }
  if (*V_00 != '\0') {
    bVar9 = 0;
    do {
      DATA_TYPE::APA::APA((APA *)&local_80);
      (*local_80.super_DataTypeBase._vptr_DataTypeBase[3])(&local_80,stream);
      std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::push_back
                (&this->m_vAPA,(value_type *)&local_80);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&local_80.super_DataTypeBase);
      bVar9 = bVar9 + 1;
    } while (bVar9 < *V_00);
  }
  if (*V_01 != '\0') {
    bVar9 = 0;
    do {
      DATA_TYPE::UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem(&local_80);
      (*local_80.super_DataTypeBase._vptr_DataTypeBase[3])(&local_80,stream);
      std::
      vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
      ::push_back(&this->m_vUAES,&local_80);
      DATA_TYPE::UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem(&local_80);
      bVar9 = bVar9 + 1;
    } while (bVar9 < *V_01);
  }
  return;
}

Assistant:

void Underwater_Acoustic_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < UNDERWATER_ACOUSTIC_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8StateUpdateIndicator
           >> m_ui8Padding1
           >> m_ui16PassiveParamIndex
           >> m_ui8PropPlantConfig
           >> m_ui8NumShafts
           >> m_ui8NumAPA
           >> m_ui8NumEmitterSys;

    m_vShafts.clear();
    m_vAPA.clear();
    m_vUAES.clear();

    for( KUINT8 i = 0; i < m_ui8NumShafts; ++i )
    {
        Shaft sft;
        stream >> KDIS_STREAM sft;
        m_vShafts.push_back( sft );
    }

    for( KUINT8 i = 0; i < m_ui8NumAPA; ++i )
    {
        APA apa;
        stream >> KDIS_STREAM apa;
        m_vAPA.push_back( apa );
    }

    for( KUINT8 i = 0; i < m_ui8NumEmitterSys; ++i )
    {
        UnderwaterAcousticEmitterSystem uaes;
        stream >> KDIS_STREAM uaes;
        m_vUAES.push_back( uaes );
    }
}